

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

Exp2LayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_exp2(NeuralNetworkLayer *this)

{
  Exp2LayerParams *this_00;
  
  if (this->_oneof_case_[0] != 700) {
    clear_layer(this);
    this->_oneof_case_[0] = 700;
    this_00 = (Exp2LayerParams *)operator_new(0x18);
    Exp2LayerParams::Exp2LayerParams(this_00);
    (this->layer_).exp2_ = this_00;
  }
  return (Exp2LayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::Exp2LayerParams* NeuralNetworkLayer::mutable_exp2() {
  if (!has_exp2()) {
    clear_layer();
    set_has_exp2();
    layer_.exp2_ = new ::CoreML::Specification::Exp2LayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.exp2)
  return layer_.exp2_;
}